

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.cc
# Opt level: O2

void __thiscall Metrics::Report(Metrics *this)

{
  uint uVar1;
  Metric *pMVar2;
  pointer ppMVar3;
  uint uVar4;
  
  uVar4 = 0;
  for (ppMVar3 = (this->metrics_).super__Vector_base<Metric_*,_std::allocator<Metric_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppMVar3 !=
      (this->metrics_).super__Vector_base<Metric_*,_std::allocator<Metric_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppMVar3 = ppMVar3 + 1) {
    uVar1 = (uint)((*ppMVar3)->name)._M_string_length;
    if ((int)uVar4 <= (int)uVar1) {
      uVar4 = uVar1;
    }
  }
  printf("%-*s\t%-6s\t%-9s\t%s\n",(ulong)uVar4,"metric","count","avg (us)","total (ms)");
  for (ppMVar3 = (this->metrics_).super__Vector_base<Metric_*,_std::allocator<Metric_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppMVar3 !=
      (this->metrics_).super__Vector_base<Metric_*,_std::allocator<Metric_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppMVar3 = ppMVar3 + 1) {
    pMVar2 = *ppMVar3;
    printf("%-*s\t%-6d\t%-8.1f\t%.1f\n",(double)pMVar2->sum / (double)pMVar2->count,
           (double)pMVar2->sum / 1000.0,(ulong)uVar4,(pMVar2->name)._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Metrics::Report() {
  int width = 0;
  for (vector<Metric*>::iterator i = metrics_.begin();
       i != metrics_.end(); ++i) {
    width = max((int)(*i)->name.size(), width);
  }

  printf("%-*s\t%-6s\t%-9s\t%s\n", width,
         "metric", "count", "avg (us)", "total (ms)");
  for (vector<Metric*>::iterator i = metrics_.begin();
       i != metrics_.end(); ++i) {
    Metric* metric = *i;
    double total = metric->sum / (double)1000;
    double avg = metric->sum / (double)metric->count;
    printf("%-*s\t%-6d\t%-8.1f\t%.1f\n", width, metric->name.c_str(),
           metric->count, avg, total);
  }
}